

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Numbering.hpp
# Opt level: O3

ostream * Lib::operator<<(ostream *out,Numbering<Kernel::Literal_*,_1U> *self)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ulong uVar2;
  undefined8 local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  if (1 < self->_nextNum) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
    local_38 = CONCAT44(1,(uint)local_38);
    DHMap<unsigned_int,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
              (&self->_rev,(uint *)((long)&local_38 + 4));
    std::ostream::_M_insert<void_const*>(poVar1);
    if (2 < self->_nextNum) {
      uVar2 = 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
        local_38 = CONCAT44(local_38._4_4_,(int)uVar2);
        DHMap<unsigned_int,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
                  (&self->_rev,(uint *)&local_38);
        std::ostream::_M_insert<void_const*>(poVar1);
        uVar2 = uVar2 + 1;
      } while (uVar2 < self->_nextNum);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Numbering const& self)
  { 
    out << "{";
    if (Start < self._nextNum) {
      out << Start << " -> " << self.obj(Start);
      for (unsigned i = Start + 1; i < self._nextNum; i++) {
        out << ", " << i << " -> " << self.obj(i);
      }
    }
    return out << "}";
  }